

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::OneofDescriptor::CopyTo(OneofDescriptor *this,OneofDescriptorProto *proto)

{
  string *initial_value;
  string *psVar1;
  OneofOptions *pOVar2;
  OneofOptions *pOVar3;
  Arena *pAVar4;
  
  initial_value = *(string **)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  pAVar4 = (Arena *)(proto->_internal_metadata_).
                    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    .ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x18);
  }
  psVar1 = (proto->name_).ptr_;
  if (psVar1 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance(&proto->name_,pAVar4,initial_value);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  pOVar3 = *(OneofOptions **)(this + 0x28);
  pOVar2 = OneofOptions::default_instance();
  if (pOVar3 != pOVar2) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    if (proto->options_ == (OneofOptions *)0x0) {
      pAVar4 = (Arena *)(proto->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x18);
      }
      pOVar3 = Arena::CreateMaybeMessage<google::protobuf::OneofOptions>(pAVar4);
      proto->options_ = pOVar3;
    }
    OneofOptions::CopyFrom(proto->options_,*(OneofOptions **)(this + 0x28));
    return;
  }
  return;
}

Assistant:

void OneofDescriptor::CopyTo(OneofDescriptorProto* proto) const {
  proto->set_name(name());
  if (&options() != &OneofOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}